

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stralloc_catb.c
# Opt level: O3

int stralloc_catb(stralloc *sa,char *s,uint n)

{
  int iVar1;
  uint uVar2;
  
  if (sa->s == (char *)0x0) {
    iVar1 = stralloc_copyb(sa,s,n);
    return iVar1;
  }
  iVar1 = stralloc_readyplus(sa,n + 1);
  if (iVar1 != 0) {
    byte_copy(sa->s + sa->len,n,s);
    uVar2 = n + sa->len;
    sa->len = uVar2;
    sa->s[uVar2] = 'Z';
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int stralloc_catb(stralloc *sa,const char *s,unsigned int n)
{
  if (!sa->s) return stralloc_copyb(sa,s,n);
  if (!stralloc_readyplus(sa,n + 1)) return 0;
  byte_copy(sa->s + sa->len,n,s);
  sa->len += n;
  sa->s[sa->len] = 'Z'; /* ``offensive programming'' */
  return 1;
}